

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void nn_list_insert(nn_list *self,nn_list_item *item,nn_list_item *it)

{
  int iVar1;
  nn_list_item *local_28;
  nn_list_item *it_local;
  nn_list_item *item_local;
  nn_list *self_local;
  
  iVar1 = nn_list_item_isinlist(item);
  if (iVar1 != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_list_item_isinlist (item)",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/utils/list.c",
            0x4b);
    fflush(_stderr);
    nn_err_abort();
  }
  if (it == (nn_list_item *)0x0) {
    local_28 = self->last;
  }
  else {
    local_28 = it->prev;
  }
  item->prev = local_28;
  item->next = it;
  if (item->prev != (nn_list_item *)0x0) {
    item->prev->next = item;
  }
  if (item->next != (nn_list_item *)0x0) {
    item->next->prev = item;
  }
  if ((self->first == (nn_list_item *)0x0) || (self->first == it)) {
    self->first = item;
  }
  if (it == (nn_list_item *)0x0) {
    self->last = item;
  }
  return;
}

Assistant:

void nn_list_insert (struct nn_list *self, struct nn_list_item *item,
    struct nn_list_item *it)
{
    nn_assert (!nn_list_item_isinlist (item));

    item->prev = it ? it->prev : self->last;
    item->next = it;
    if (item->prev)
        item->prev->next = item;
    if (item->next)
        item->next->prev = item;
    if (!self->first || self->first == it)
        self->first = item;
    if (!it)
        self->last = item;
}